

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * __thiscall
cmCTest::GetTestModelString_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  int iVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  size_type sVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  sVar3 = *(size_type *)((long)&(_Var2._M_head_impl)->SpecificTrack + 8);
  if (sVar3 == 0) {
    iVar1 = (_Var2._M_head_impl)->TestModel;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == 2) {
      pcVar6 = "Continuous";
      pcVar5 = "";
    }
    else if (iVar1 == 1) {
      pcVar6 = "Nightly";
      pcVar5 = "";
    }
    else {
      pcVar6 = "Experimental";
      pcVar5 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar4 = *(long *)&((_Var2._M_head_impl)->SpecificTrack)._M_dataplus;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar4,sVar3 + lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetTestModelString()
{
  if (!this->Impl->SpecificTrack.empty()) {
    return this->Impl->SpecificTrack;
  }
  switch (this->Impl->TestModel) {
    case cmCTest::NIGHTLY:
      return "Nightly";
    case cmCTest::CONTINUOUS:
      return "Continuous";
  }
  return "Experimental";
}